

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.h
# Opt level: O3

void __thiscall
Liby::BinaryHeap<Liby::WeakTimerHolder>::percolate_down
          (BinaryHeap<Liby::WeakTimerHolder> *this,size_type_conflict hole)

{
  _Atomic_word *p_Var1;
  BasicHandler *pBVar2;
  ulong uVar3;
  pointer pWVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  __suseconds_t _Var9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  Timestamp *pTVar13;
  uint uVar14;
  pointer pWVar15;
  pointer pWVar16;
  uint uVar17;
  ulong uVar18;
  WeakTimerHolder tmp;
  _Any_data local_60;
  code *local_50;
  element_type *local_40;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  uVar18 = (ulong)hole;
  pBVar2 = &(this->heap).
            super__Vector_base<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar18].timer_.handler_;
  uVar3 = *(ulong *)((long)(pBVar2 + -1) + 8);
  lVar7 = *(long *)((long)(pBVar2 + -1) + 0x10);
  lVar8 = *(long *)((long)(pBVar2 + -1) + 0x18);
  std::function<void_()>::function((function<void_()> *)&local_60,pBVar2);
  local_40 = *(element_type **)(pBVar2 + 1);
  local_38._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(pBVar2 + 1) + 8);
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38._M_pi)->_M_weak_count = (local_38._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_38._M_pi)->_M_weak_count = (local_38._M_pi)->_M_weak_count + 1;
    }
  }
  uVar10 = hole * 2;
  uVar14 = this->size_;
  if (uVar10 <= uVar14) {
    do {
      uVar12 = (ulong)uVar10;
      pWVar4 = (this->heap).
               super__Vector_base<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar18 = (ulong)uVar14;
      if (uVar10 != uVar14) {
        pWVar16 = pWVar4 + (uVar10 | 1);
        pWVar15 = pWVar4 + uVar12;
        lVar5 = (pWVar16->timer_).timeout_.tv_.tv_sec;
        lVar6 = (pWVar15->timer_).timeout_.tv_.tv_sec;
        uVar18 = uVar12;
        if (((lVar5 < lVar6) ||
            ((lVar5 <= lVar6 &&
             ((pWVar16->timer_).timeout_.tv_.tv_usec < (pWVar15->timer_).timeout_.tv_.tv_usec)))) &&
           ((pWVar16->timer_).id_ < (pWVar15->timer_).id_)) {
          uVar18 = (ulong)(uVar10 | 1);
        }
      }
      uVar17 = (uint)uVar18;
      pWVar16 = pWVar4 + uVar18;
      lVar5 = (pWVar16->timer_).timeout_.tv_.tv_sec;
      if (((lVar7 <= lVar5) &&
          ((lVar7 < lVar5 || (lVar8 <= (pWVar16->timer_).timeout_.tv_.tv_usec)))) ||
         (uVar12 = (pWVar16->timer_).id_, uVar3 <= uVar12)) break;
      pTVar13 = &pWVar4[uVar18].timer_.timeout_;
      pBVar2 = &pWVar4[hole].timer_.handler_;
      *(ulong *)((long)(pBVar2 + -1) + 8) = uVar12;
      _Var9 = (pTVar13->tv_).tv_usec;
      *(__time_t *)((long)(pBVar2 + -1) + 0x10) = (pTVar13->tv_).tv_sec;
      *(__suseconds_t *)((long)(pBVar2 + -1) + 0x18) = _Var9;
      std::function<void_()>::operator=(pBVar2,&(pWVar16->timer_).handler_);
      pWVar4[hole].weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pWVar16->weakTimerPtr_).super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&pWVar4[hole].weakTimerPtr_.
                  super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &(pWVar16->weakTimerPtr_).super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      uVar10 = uVar17 * 2;
      uVar14 = this->size_;
      hole = uVar17;
    } while (uVar10 <= uVar14);
    uVar18 = (ulong)hole;
  }
  pWVar4 = (this->heap).
           super__Vector_base<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>._M_impl
           .super__Vector_impl_data._M_start;
  pBVar2 = &pWVar4[uVar18].timer_.handler_;
  *(ulong *)((long)(pBVar2 + -1) + 8) = uVar3;
  *(long *)((long)(pBVar2 + -1) + 0x10) = lVar7;
  *(long *)((long)(pBVar2 + -1) + 0x18) = lVar8;
  std::function<void_()>::operator=(pBVar2,(function<void_()> *)&local_60);
  pWVar4[uVar18].weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_40;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&pWVar4[uVar18].weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,&local_38);
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_38._M_pi)->_M_weak_count;
      iVar11 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar11 = (local_38._M_pi)->_M_weak_count;
      (local_38._M_pi)->_M_weak_count = iVar11 + -1;
    }
    if (iVar11 == 1) {
      (*(local_38._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  return;
}

Assistant:

void percolate_down(size_type hole) {
        size_type child;
        T tmp = heap[hole];

        for (; hole * 2 <= size_; hole = child) {
            child = hole * 2;
            if (child != size_ && heap[child + 1] < heap[child])
                child++;
            if (heap[child] < tmp) {
                heap[hole] = heap[child];
            } else {
                break;
            }
        }
        heap[hole] = tmp;
    }